

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O1

ParserState * giveup_to_expected(ParserState *__return_storage_ptr__,ParserState *state,char *what)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  token_iterator pTVar5;
  bool bVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char **in_RCX;
  _Alloc_hider _Var8;
  size_type *psVar9;
  size_type *psVar10;
  anon_class_1_0_00000001 local_c9;
  ParserState *local_c8;
  string local_c0;
  ParserError local_a0;
  char *local_70;
  ParserError local_68;
  
  local_70 = what;
  bVar6 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    (&local_c9,&state->_storage);
  if (bVar6) {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)__return_storage_ptr__,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)state);
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->_storage).
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0 = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_storage).
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             .
             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
             .field_0 + 8) = 0;
    (__return_storage_ptr__->_storage).
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
    local_c8 = __return_storage_ptr__;
    if ((state->_storage).
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        ._which != 2) {
      eggs::variants::detail::throw_bad_variant_access<llvm_vecsmall::SmallVector<ParserError,1u>&>
                ();
    }
    psVar9 = *(size_type **)
              &(state->_storage).
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0;
    psVar4 = *(size_type **)
              ((long)&(state->_storage).
                      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                      .
                      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                      .
                      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                      .field_0 + 8);
    if (psVar9 != psVar4) {
      paVar3 = &local_68.error.field_2;
      paVar1 = &local_a0.error.field_2;
      paVar2 = &local_c0.field_2;
      psVar9 = psVar9 + 4;
      do {
        if ((int)psVar9[-4] == 0) {
          pTVar5 = (token_iterator)psVar9[-3];
          fmt::format<char_const*>(&local_c0,(fmt *)"expected {}",(CStringRef)&local_70,in_RCX);
          local_a0.state = Error;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p == paVar2) {
            local_a0.error.field_2._8_8_ = local_c0.field_2._8_8_;
            local_a0.error._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_a0.error._M_dataplus._M_p = local_c0._M_dataplus._M_p;
          }
          local_a0.error.field_2._M_allocated_capacity._1_7_ =
               local_c0.field_2._M_allocated_capacity._1_7_;
          local_a0.error.field_2._M_local_buf[0] = local_c0.field_2._M_local_buf[0];
          local_a0.error._M_string_length = local_c0._M_string_length;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_local_buf[0] = '\0';
          local_c0._M_dataplus._M_p = (pointer)paVar2;
          local_a0.context = pTVar5;
          add_error(local_c8,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.error._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0.error._M_dataplus._M_p,
                            local_a0.error.field_2._M_allocated_capacity + 1);
          }
          paVar7 = paVar2;
          __return_storage_ptr__ = local_c8;
          _Var8._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar2) goto LAB_001992fb;
        }
        else {
          local_68._0_8_ = psVar9[-4];
          local_68.context = (token_iterator)psVar9[-3];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9[-2]) {
            local_68.error.field_2._M_allocated_capacity = *psVar9;
            local_68.error.field_2._8_8_ = psVar9[1];
            local_68.error._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_68.error.field_2._M_allocated_capacity = *psVar9;
            local_68.error._M_dataplus._M_p = (pointer)psVar9[-2];
          }
          local_68.error._M_string_length = psVar9[-1];
          psVar9[-2] = (size_type)psVar9;
          psVar9[-1] = 0;
          *(undefined1 *)psVar9 = 0;
          add_error(__return_storage_ptr__,&local_68);
          paVar7 = paVar3;
          _Var8._M_p = local_68.error._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.error._M_dataplus._M_p != paVar3) {
LAB_001992fb:
            operator_delete(_Var8._M_p,paVar7->_M_allocated_capacity + 1);
          }
        }
        psVar10 = psVar9 + 2;
        psVar9 = psVar9 + 6;
      } while (psVar10 != psVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserState giveup_to_expected(ParserState state, const char* what)
{
    if(!is<ParserSuccess>(state))
    {
        ParserState new_state = ParserSuccess(nullptr);
        for(auto& e : get<ParserFailure>(state))
        {
            if(e.state == ParserStatus::GiveUp)
                add_error(new_state, ParserError(ParserStatus::Error, e.context, fmt::format("expected {}", what)));
            else
                add_error(new_state, std::move(e));
        }
        return new_state;
    }
    return state;
}